

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

StringEntry * __thiscall cmELF::GetRunPath(cmELF *this)

{
  bool bVar1;
  FileType FVar2;
  pointer pcVar3;
  cmELF *this_local;
  
  bVar1 = Valid(this);
  if (bVar1) {
    pcVar3 = std::unique_ptr<cmELFInternal,_std::default_delete<cmELFInternal>_>::operator->
                       (&this->Internal);
    FVar2 = cmELFInternal::GetFileType(pcVar3);
    if (FVar2 != FileTypeExecutable) {
      pcVar3 = std::unique_ptr<cmELFInternal,_std::default_delete<cmELFInternal>_>::operator->
                         (&this->Internal);
      FVar2 = cmELFInternal::GetFileType(pcVar3);
      if (FVar2 != FileTypeSharedLibrary) goto LAB_00133052;
    }
    pcVar3 = std::unique_ptr<cmELFInternal,_std::default_delete<cmELFInternal>_>::operator->
                       (&this->Internal);
    this_local = (cmELF *)cmELFInternal::GetRunPath(pcVar3);
  }
  else {
LAB_00133052:
    this_local = (cmELF *)0x0;
  }
  return (StringEntry *)this_local;
}

Assistant:

cmELF::StringEntry const* cmELF::GetRunPath()
{
  if (this->Valid() &&
      (this->Internal->GetFileType() == cmELF::FileTypeExecutable ||
       this->Internal->GetFileType() == cmELF::FileTypeSharedLibrary)) {
    return this->Internal->GetRunPath();
  }
  return nullptr;
}